

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void ModulusHelper<unsigned_long,_long,_3>::
     ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long *t,long *u,unsigned_long *result)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  
  if (*in_RSI == 0) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  if ((long)*in_RSI < 0) {
    uVar1 = *in_RDI;
    uVar2 = AbsValueHelper<long,_1>::Abs(0x1e17e8);
    *in_RDX = uVar1 % uVar2;
  }
  else {
    *in_RDX = *in_RDI % *in_RSI;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        // u could be negative - if so, need to convert to positive
        if(u < 0)
            result = (T)(t % AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( u ));
        else
            result = (T)(t % u);
    }